

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

void __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::dump(basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
       *this,ostream *os,bool recursive)

{
  byte bVar1;
  ulong uVar2;
  uint8_t i;
  atomic<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> local_38;
  
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  ::dump((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
          *)this,os,recursive);
  bVar1 = this->field_0x20;
  std::operator<<(os,", key_bytes:");
  for (uVar2 = 0; bVar1 != uVar2; uVar2 = uVar2 + 1) {
    dump_byte(os,*(byte *)((long)(this->children)._M_elems + (uVar2 - 4)));
  }
  if (recursive) {
    std::operator<<(os,", children:  \n");
    for (uVar2 = 0; bVar1 != uVar2; uVar2 = uVar2 + 1) {
      local_38._M_i.tagged_ptr =
           (basic_node_ptr<unodb::detail::olc_node_header>)
           (this->children)._M_elems[uVar2].value._M_i.tagged_ptr;
      basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
      ::dump_node(os,&local_38._M_i,true);
    }
  }
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream &os,
                                                bool recursive) const {
    parent_class::dump(os, recursive);
    const auto children_count_ = this->children_count.load();
    os << ", key_bytes:";
    for (std::uint8_t i = 0; i < children_count_; i++)
      dump_byte(os, keys.byte_array[i]);
    if (recursive) {
      os << ", children:  \n";
      for (std::uint8_t i = 0; i < children_count_; i++)
        ArtPolicy::dump_node(os, children[i].load());
    }
  }